

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::OutOfRangeException::
OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (OutOfRangeException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (params->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + params->_M_string_length);
  pcVar1 = (params_1->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + params_1->_M_string_length);
  pcVar1 = (params_2->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + params_2->_M_string_length);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_50,(Exception *)msg,&local_70,&local_90,&local_b0,in_R9);
  OutOfRangeException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}